

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execShiftIm<(moira::Core)2,(moira::Instr)95,(moira::Mode)11,4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  this->cp = 0;
  uVar5 = 8;
  if ((opcode & 0xe00) != 0) {
    uVar5 = opcode >> 9 & 7;
  }
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  this->readBuffer = (u16)uVar1;
  uVar4 = (ulong)*(uint *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4);
  do {
    uVar3 = uVar4;
    uVar4 = (ulong)(uint)((int)uVar3 << 0x1f) | uVar3 >> 1;
    uVar5 = uVar5 - 1;
  } while (uVar5 != 0);
  (this->reg).sr.c = (bool)((byte)uVar3 & 1);
  (this->reg).sr.v = false;
  iVar2 = (int)uVar4;
  (this->reg).sr.n = (bool)((byte)uVar3 & 1);
  (this->reg).sr.z = iVar2 == 0;
  *(int *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4) = iVar2;
  (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 8));
  return;
}

Assistant:

void
Moira::execShiftIm(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);
    int cnt = src ? src : 8;
    int cyc = (S == Long ? 4 : 2) + 2 * cnt;

    prefetch<C, POLL>();
    SYNC(cyc);

    writeD<S>(dst, shift<C, I, S>(cnt, readD<S>(dst)));

    if constexpr (C == Core::C68000 || C == Core::C68010) {

        CYCLES(4 + cyc);

    } else {

        switch (I) {

            case Instr::LSL:
            case Instr::LSR:
                
                CYCLES(4);
                break;
                
            case Instr::ROL:
            case Instr::ROR:
            case Instr::ASL:
                
                CYCLES(8);
                break;
                
            case Instr::ROXL:
            case Instr::ROXR:
                
                CYCLES(12);
                break;
                
            default:
                
                CYCLES(6);
                break;
        }
    }

    FINALIZE
}